

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O3

char * CVmBif::pop_list_val(void)

{
  vm_val_t *pvVar1;
  vm_val_t *pvVar2;
  uint uVar3;
  char *pcVar4;
  
  pvVar1 = sp_ + -1;
  pvVar2 = sp_ + -1;
  uVar3 = sp_[-1].val.obj;
  sp_ = pvVar1;
  if (pvVar2->typ == VM_OBJ) {
    pcVar4 = (char *)(**(code **)(*(long *)&G_obj_table_X.pages_[uVar3 >> 0xc][uVar3 & 0xfff].ptr_ +
                                 400))();
    if (pcVar4 == (char *)0x0) goto LAB_0025615b;
  }
  else {
    if (pvVar2->typ != VM_LIST) {
LAB_0025615b:
      err_throw(0x7e4);
    }
    pcVar4 = G_const_pool_X.super_CVmPoolPaged.pages_
             [uVar3 >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
             (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & uVar3);
  }
  return pcVar4;
}

Assistant:

const char *CVmBif::pop_list_val(VMG0_)
{
    vm_val_t val;
    CVmObject *obj;
    const char *p;

    /* pop the value */
    G_stk->pop(&val);

    /* see what we have */
    switch(val.typ)
    {
    case VM_LIST:
        /* it's a constant list - get the constant pool pointer */
        return G_const_pool->get_ptr(val.val.ofs);

    case VM_OBJ:
        /* get the object */
        obj = vm_objp(vmg_ val.val.obj);

        /* get the list value, if it has one */
        p = obj->get_as_list();

        /* if it has a list value, return it */
        if (p != 0)
            return p;

        /* we didn't get a list value */
        break;

    default:
        /* other types don't have a list value */
        break;
    }

    /* if we got here, the value isn't a list */
    err_throw(VMERR_LIST_VAL_REQD);
    AFTER_ERR_THROW(return 0;)
}